

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroup::Append
          (RowGroup *this,RowGroupAppendState *state,DataChunk *chunk,idx_t append_count)

{
  idx_t iVar1;
  ColumnData *this_00;
  idx_t iVar2;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  idx_t in_stack_00000008;
  Vector *in_stack_00000010;
  ColumnAppendState *in_stack_00000018;
  idx_t prev_allocation_size;
  ColumnData *col_data;
  idx_t i;
  storage_t in_stack_000001f0;
  RowGroup *in_stack_000001f8;
  ColumnData *__n;
  type in_stack_ffffffffffffffb0;
  undefined8 local_28;
  
  local_28 = 0;
  while( true ) {
    iVar1 = GetColumnCount((RowGroup *)0xbaa97f);
    if (iVar1 <= local_28) break;
    this_00 = GetColumn(in_stack_000001f8,in_stack_000001f0);
    iVar1 = ColumnData::GetAllocationSize(this_00);
    __n = this_00;
    in_stack_ffffffffffffffb0 =
         unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState>,_false>
         ::operator[]((unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState>,_false>
                       *)in_stack_ffffffffffffffb0,(size_t)this_00);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffffb0,(size_type)__n);
    ColumnData::Append((ColumnData *)prev_allocation_size,in_stack_00000018,in_stack_00000010,
                       in_stack_00000008);
    iVar2 = ColumnData::GetAllocationSize(this_00);
    *(idx_t *)(in_RDI + 0xc0) = (iVar2 - iVar1) + *(long *)(in_RDI + 0xc0);
    local_28 = local_28 + 1;
  }
  *(long *)(in_RSI + 0x18) = in_RCX + *(long *)(in_RSI + 0x18);
  return;
}

Assistant:

void RowGroup::Append(RowGroupAppendState &state, DataChunk &chunk, idx_t append_count) {
	// append to the current row_group
	D_ASSERT(chunk.ColumnCount() == GetColumnCount());
	for (idx_t i = 0; i < GetColumnCount(); i++) {
		auto &col_data = GetColumn(i);
		auto prev_allocation_size = col_data.GetAllocationSize();
		col_data.Append(state.states[i], chunk.data[i], append_count);
		allocation_size += col_data.GetAllocationSize() - prev_allocation_size;
	}
	state.offset_in_row_group += append_count;
}